

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_state_machine_cache.hpp
# Opt level: O2

string * __thiscall
duckdb::CSVStateMachineCache::GetObjectType_abi_cxx11_
          (string *__return_storage_ptr__,CSVStateMachineCache *this)

{
  ObjectType_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

string GetObjectType() override {
		return ObjectType();
	}